

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDefinedMeasurementCollector.cpp
# Opt level: O1

void __thiscall
celero::UserDefinedMeasurementCollector::collect
          (UserDefinedMeasurementCollector *this,shared_ptr<celero::TestFixture> *fixture)

{
  element_type *peVar1;
  element_type *peVar2;
  mapped_type *pmVar3;
  pointer psVar4;
  shared_ptr<celero::UserDefinedMeasurement> udm;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  udms;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  key_type local_68;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  local_48;
  
  (*((fixture->super___shared_ptr<celero::TestFixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_TestFixture[9])(&local_48);
  if (local_48.
      super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar4 = local_48.
             super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar4->
               super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_70._M_pi =
           (psVar4->super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
        }
      }
      (**(code **)(*(long *)peVar1 + 0x18))(&local_68);
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&local_68);
      peVar2 = (pmVar3->
               super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (peVar2 == (element_type *)0x0) {
        (**(code **)(*(long *)peVar1 + 0x18))(&local_68);
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_68);
        (pmVar3->super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = peVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar3->
                    super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,&local_70);
      }
      else {
        (**(code **)(*(long *)peVar1 + 0x18))(&local_68);
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_68);
        peVar2 = (pmVar3->
                 super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (**(code **)(*(long *)peVar2 + 0x20))(peVar2,peVar1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != local_48.
                       super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void UserDefinedMeasurementCollector::collect(std::shared_ptr<TestFixture> fixture)
{
	const auto udms = fixture->getUserDefinedMeasurements();

	if(udms.empty() == false)
	{
		for(auto udm : udms)
		{
			if(this->collected[udm->getName()] == nullptr)
			{
				this->collected[udm->getName()] = udm;
			}
			else
			{
				this->collected[udm->getName()]->merge(&*udm);
			}
		}
	}
}